

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O2

bool S2::IntersectsRect(R2Point *a,R2Point *b,R2Rect *rect)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  R2Point RVar7;
  R2Point RVar8;
  R2Rect bound;
  R2Rect local_48;
  
  R2Rect::FromPointPair(&local_48,a,b);
  bVar3 = R2Rect::Intersects(rect,&local_48);
  if (bVar3) {
    dVar5 = b->c_[0] - a->c_[0];
    dVar6 = b->c_[1] - a->c_[1];
    RVar7 = R2Rect::GetVertex(rect,(uint)(0.0 >= dVar6),(uint)(dVar5 >= 0.0));
    dVar1 = a->c_[0];
    dVar2 = a->c_[1];
    RVar8 = R2Rect::GetVertex(rect,(uint)(0.0 < dVar6),(uint)(dVar5 < 0.0));
    bVar4 = -(0.0 <= (RVar7.c_[1] - dVar2) * dVar5 + (0.0 - (RVar7.c_[0] - dVar1) * dVar6)) &
            -((0.0 - (RVar8.c_[0] - a->c_[0]) * dVar6) + (RVar8.c_[1] - a->c_[1]) * dVar5 <= 0.0);
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool IntersectsRect(const R2Point& a, const R2Point& b, const R2Rect& rect) {
  // First check whether the bound of AB intersects "rect".
  R2Rect bound = R2Rect::FromPointPair(a, b);
  if (!rect.Intersects(bound)) return false;

  // Otherwise AB intersects "rect" if and only if all four vertices of "rect"
  // do not lie on the same side of the extended line AB.  We test this by
  // finding the two vertices of "rect" with minimum and maximum projections
  // onto the normal of AB, and computing their dot products with the edge
  // normal.
  R2Point n = (b - a).Ortho();
  int i = (n[0] >= 0) ? 1 : 0;
  int j = (n[1] >= 0) ? 1 : 0;
  double max = n.DotProd(rect.GetVertex(i, j) - a);
  double min = n.DotProd(rect.GetVertex(1-i, 1-j) - a);
  return (max >= 0) && (min <= 0);
}